

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

QTextFrame * __thiscall
QTextDocumentPrivate::insertFrame
          (QTextDocumentPrivate *this,int start,int end,QTextFrameFormat *format)

{
  int blockFormat;
  int iVar1;
  QTextFrame *pQVar2;
  QTextFrame *pQVar3;
  QObject *object;
  QTextObject *this_00;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (start != end) {
    pQVar2 = frameAt(this,start);
    pQVar3 = frameAt(this,end);
    if (pQVar2 != pQVar3) {
      this_00 = (QTextObject *)0x0;
      goto LAB_00462397;
    }
  }
  beginEditBlock(this);
  object = &createObject(this,&format->super_QTextFormat,-1)->super_QObject;
  this_00 = &QtPrivate::qobject_cast_helper<QTextFrame*,QObject>(object)->super_QTextObject;
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)local_48);
  blockFormat = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_48);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_48);
  iVar1 = QTextObject::objectIndex(this_00);
  QTextFormat::setObjectIndex((QTextFormat *)local_48,iVar1);
  iVar1 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_48);
  insertBlock(this,(QChar)0xfdd0,start,blockFormat,iVar1,MoveCursor);
  insertBlock(this,(QChar)0xfdd1,end + 1,blockFormat,iVar1,KeepCursor);
  find((QTextDocumentPrivate *)local_58,(int)this);
  *(undefined4 *)(*(long *)&this_00->field_0x8 + 0x84) = local_58._8_4_;
  find((QTextDocumentPrivate *)local_58,(int)this);
  *(undefined4 *)(*(long *)&this_00->field_0x8 + 0x88) = local_58._8_4_;
  insert_frame(this,(QTextFrame *)this_00);
  endEditBlock(this);
  QTextFormat::~QTextFormat((QTextFormat *)local_48);
LAB_00462397:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QTextFrame *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QTextFrame *QTextDocumentPrivate::insertFrame(int start, int end, const QTextFrameFormat &format)
{
    Q_ASSERT(start >= 0 && start < length());
    Q_ASSERT(end >= 0 && end < length());
    Q_ASSERT(start <= end || end == -1);

    if (start != end && frameAt(start) != frameAt(end))
        return nullptr;

    beginEditBlock();

    QTextFrame *frame = qobject_cast<QTextFrame *>(createObject(format));
    Q_ASSERT(frame);

    // #### using the default block and char format below might be wrong
    int idx = formats.indexForFormat(QTextBlockFormat());
    QTextCharFormat cfmt;
    cfmt.setObjectIndex(frame->objectIndex());
    int charIdx = formats.indexForFormat(cfmt);

    insertBlock(QTextBeginningOfFrame, start, idx, charIdx, QTextUndoCommand::MoveCursor);
    insertBlock(QTextEndOfFrame, ++end, idx, charIdx, QTextUndoCommand::KeepCursor);

    frame->d_func()->fragment_start = find(start).n;
    frame->d_func()->fragment_end = find(end).n;

    insert_frame(frame);

    endEditBlock();

    return frame;
}